

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

SplitTuplePromise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> * __thiscall
kj::_::ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>>::splitImpl<0ul,1ul,2ul>
          (ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_>
           *__return_storage_ptr__)

{
  Promise<int> *in_R8;
  Own<kj::_::PromiseNode> local_40;
  Own<kj::_::PromiseNode> local_30;
  Own<kj::_::PromiseNode> local_20;
  
  addSplit<0ul>((ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>> *)&local_20);
  addSplit<1ul>((ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>> *)&local_30);
  addSplit<2ul>((ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>> *)&local_40);
  tuple<kj::Promise<int>,kj::Promise<kj::String>,kj::Promise<int>>
            (__return_storage_ptr__,(kj *)&local_20,(Promise<int> *)&local_30,
             (Promise<kj::String> *)&local_40,in_R8);
  Own<kj::_::PromiseNode>::dispose(&local_40);
  Own<kj::_::PromiseNode>::dispose(&local_30);
  Own<kj::_::PromiseNode>::dispose(&local_20);
  return __return_storage_ptr__;
}

Assistant:

_::SplitTuplePromise<T> splitImpl(Indexes<indexes...>) {
    return kj::tuple(addSplit<indexes>()...);
  }